

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O0

bool CheckConvertToUnixSlashes(string *input,string *output)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_40 [8];
  string result;
  string *output_local;
  string *input_local;
  
  result.field_2._8_8_ = output;
  std::__cxx11::string::string((string *)local_40,(string *)input);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_40);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)result.field_2._8_8_);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Problem with ConvertToUnixSlashes - input: ");
    poVar2 = std::operator<<(poVar2,(string *)input);
    poVar2 = std::operator<<(poVar2," output: ");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    poVar2 = std::operator<<(poVar2," expected: ");
    poVar2 = std::operator<<(poVar2,(string *)result.field_2._8_8_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  input_local._7_1_ = !bVar1;
  std::__cxx11::string::~string((string *)local_40);
  return input_local._7_1_;
}

Assistant:

static bool CheckConvertToUnixSlashes(std::string const& input,
                                      std::string const& output)
{
  std::string result = input;
  kwsys::SystemTools::ConvertToUnixSlashes(result);
  if (result != output) {
    std::cerr << "Problem with ConvertToUnixSlashes - input: " << input
              << " output: " << result << " expected: " << output << std::endl;
    return false;
  }
  return true;
}